

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O2

void __thiscall DNSResolve::HandleEvent(DNSResolve *this,SOCKET s,int event)

{
  int iVar1;
  time_t tVar2;
  _List_node_base *p_Var3;
  string *this_00;
  int addr_len;
  string local_448 [32];
  sockaddr_in addr;
  char recv_data [1024];
  
  if (this->dns_socket_ == s) {
    if ((event & 8U) == 0) {
      addr_len = 0x10;
      BufferRecvFrom(s,recv_data,0x400,(sockaddr *)&addr,&addr_len);
      p_Var3 = (_List_node_base *)&this->servers_;
      do {
        p_Var3 = (((_List_base<sockaddr_in,_std::allocator<sockaddr_in>_> *)&p_Var3->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var3 == (_List_node_base *)&this->servers_) {
          Log::GetInstance();
          Log::FormatTime_abi_cxx11_();
          std::operator<<((ostream *)&std::cout,local_448);
          std::operator<<((ostream *)&std::cout," [warning] ");
          std::operator<<((ostream *)&std::cout,"received a packet other than our dns\n");
          this_00 = local_448;
          goto LAB_00117f2e;
        }
      } while (addr.sin_addr.s_addr != *(in_addr_t *)((long)&p_Var3[1]._M_next + 4));
      iVar1 = HandleData(this,recv_data);
      if (iVar1 != 0) {
        Log::GetInstance();
        Log::FormatTime_abi_cxx11_();
        std::operator<<((ostream *)&std::cout,local_448);
        std::operator<<((ostream *)&std::cout," [warning] ");
        std::operator<<((ostream *)&std::cout,"resolve dns failed\n");
        std::__cxx11::string::~string(local_448);
      }
    }
    else {
      Log::GetInstance();
      Log::FormatTime_abi_cxx11_();
      std::operator<<((ostream *)&std::cout,(string *)recv_data);
      std::operator<<((ostream *)&std::cout," [info] ");
      std::operator<<((ostream *)&std::cout,"dns socket error");
      std::__cxx11::string::~string((string *)recv_data);
      EventLoop::Remove(this->event_loop_,this->dns_socket_);
      iVar1 = socket(2,2,0x11);
      this->dns_socket_ = iVar1;
      SetNoBlocking(iVar1);
      EventLoop::Add(this->event_loop_,this->dns_socket_,1,&this->super_ISockNotify);
    }
    tVar2 = time((time_t *)0x0);
    if (0x1d < tVar2 - this->last_time_) {
      LRUCache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Sweep(&this->dns_cache_);
      this->last_time_ = tVar2;
    }
  }
  else {
    Log::GetInstance();
    Log::FormatTime_abi_cxx11_();
    std::operator<<((ostream *)&std::cout,(string *)recv_data);
    std::operator<<((ostream *)&std::cout," [error] ");
    std::operator<<((ostream *)&std::cout,"handle event from a error socket\n");
    this_00 = (string *)recv_data;
LAB_00117f2e:
    std::__cxx11::string::~string(this_00);
  }
  return;
}

Assistant:

void DNSResolve::HandleEvent(SOCKET s, int event)
{
    if (s != dns_socket_)
    {
        LOGE << "handle event from a error socket\n";
        return;
    }
    if (event & kPollErr)
    {
        //socket error,create new
        LOGI << "dns socket error";
        event_loop_->Remove(dns_socket_);
        dns_socket_ = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
        SetNoBlocking(dns_socket_);
        event_loop_->Add(dns_socket_, kPollIn, this);
    }
    else
    {
        char recv_data[1024];
        sockaddr_in addr;
        int addr_len = sizeof(sockaddr_in);
        BufferRecvFrom(s, recv_data, 1024, (sockaddr*)&addr, &addr_len);
        //check packet is from our dns server
        bool find = false;
        for (auto& dns_server_addr : servers_)
        {
            if (addr.sin_addr.s_addr ==
                    dns_server_addr.sin_addr.s_addr)
            {
                find = true;
                break;
            }
        }
        if (!find)
        {
            LOGW << "received a packet other than our dns\n";
            return;
        }
        if (0 != HandleData(recv_data))
        {
            LOGW << "resolve dns failed\n";
        }
    }
    time_t now = time(NULL);
    if (now - this->last_time_ >= kCacheSweepInterval)
    {
        dns_cache_.Sweep();
        this->last_time_ = now;
    }
}